

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct.cpp
# Opt level: O1

int __thiscall ncnn::InnerProduct::create_pipeline(InnerProduct *this,Option *opt)

{
  Mat *this_00;
  int *piVar1;
  void *__ptr;
  Allocator *pAVar2;
  ulong uVar3;
  bool bVar4;
  bool bVar5;
  Option opt_q;
  Mat local_168;
  Mat local_118;
  Mat local_c8;
  Option local_78;
  
  if (((opt->use_int8_inference == true) && ((this->weight_data).elemsize == 4)) &&
     (this->int8_scale_term != 0)) {
    this_00 = &this->weight_data;
    Mat::reshape(&local_c8,this_00,this->weight_data_size / this->num_output,this->num_output,
                 (Allocator *)0x0);
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118._20_8_ = 0;
    local_118.allocator = (Allocator *)0x0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    local_78.lightmode = opt->lightmode;
    local_78._1_3_ = *(undefined3 *)&opt->field_0x1;
    local_78.num_threads = opt->num_threads;
    local_78.blob_allocator = opt->blob_allocator;
    local_78.workspace_allocator = opt->workspace_allocator;
    local_78.openmp_blocktime = opt->openmp_blocktime;
    local_78.use_winograd_convolution = opt->use_winograd_convolution;
    local_78.use_sgemm_convolution = opt->use_sgemm_convolution;
    local_78.use_int8_inference = opt->use_int8_inference;
    local_78.use_vulkan_compute = opt->use_vulkan_compute;
    uVar3._0_1_ = opt->use_bf16_storage;
    uVar3._1_1_ = opt->use_fp16_packed;
    uVar3._2_1_ = opt->use_fp16_storage;
    uVar3._3_1_ = opt->use_fp16_arithmetic;
    uVar3._4_1_ = opt->use_int8_packed;
    uVar3._5_1_ = opt->use_int8_storage;
    uVar3._6_1_ = opt->use_int8_arithmetic;
    uVar3._7_1_ = opt->use_packing_layout;
    local_78.use_shader_pack8 = opt->use_shader_pack8;
    local_78.use_subgroup_basic = opt->use_subgroup_basic;
    local_78.use_subgroup_vote = opt->use_subgroup_vote;
    local_78.use_subgroup_ballot = opt->use_subgroup_ballot;
    local_78.use_subgroup_shuffle = opt->use_subgroup_shuffle;
    local_78.use_image_storage = opt->use_image_storage;
    local_78.use_tensor_storage = opt->use_tensor_storage;
    local_78.use_reserved_0 = opt->use_reserved_0;
    local_78.flush_denormals = opt->flush_denormals;
    local_78.use_local_pool_allocator = opt->use_local_pool_allocator;
    local_78.use_shader_local_memory = opt->use_shader_local_memory;
    local_78.use_cooperative_matrix = opt->use_cooperative_matrix;
    local_78.use_winograd23_convolution = opt->use_winograd23_convolution;
    local_78.use_winograd43_convolution = opt->use_winograd43_convolution;
    local_78.use_winograd63_convolution = opt->use_winograd63_convolution;
    local_78.use_a53_a55_optimized_kernel = opt->use_a53_a55_optimized_kernel;
    local_78.use_reserved_7 = opt->use_reserved_7;
    local_78.use_reserved_8 = opt->use_reserved_8;
    local_78.use_reserved_9 = opt->use_reserved_9;
    local_78.use_reserved_10 = opt->use_reserved_10;
    local_78.use_reserved_11 = opt->use_reserved_11;
    local_78._32_8_ = uVar3 & 0xffffffffffffff;
    quantize_to_int8(&local_c8,&local_118,&this->weight_data_int8_scales,&local_78);
    bVar4 = local_118.data == (void *)0x0;
    bVar5 = (long)local_118.c * local_118.cstep == 0;
    if (!bVar4 && !bVar5) {
      Mat::reshape(&local_168,&local_118,this->weight_data_size,(Allocator *)0x0);
      if (this_00 != &local_168) {
        if (local_168.refcount != (int *)0x0) {
          LOCK();
          *local_168.refcount = *local_168.refcount + 1;
          UNLOCK();
        }
        piVar1 = (this->weight_data).refcount;
        if (piVar1 != (int *)0x0) {
          LOCK();
          *piVar1 = *piVar1 + -1;
          UNLOCK();
          if (*piVar1 == 0) {
            __ptr = (this->weight_data).data;
            pAVar2 = (this->weight_data).allocator;
            if (pAVar2 == (Allocator *)0x0) {
              if (__ptr != (void *)0x0) {
                free(__ptr);
              }
            }
            else {
              (*pAVar2->_vptr_Allocator[3])();
            }
          }
        }
        (this->weight_data).cstep = 0;
        *(undefined8 *)((long)&(this->weight_data).refcount + 4) = 0;
        *(undefined8 *)((long)&(this->weight_data).elemsize + 4) = 0;
        this_00->data = (void *)0x0;
        (this->weight_data).refcount = (int *)0x0;
        (this->weight_data).dims = 0;
        (this->weight_data).w = 0;
        (this->weight_data).h = 0;
        (this->weight_data).d = 0;
        (this->weight_data).c = 0;
        (this->weight_data).data = local_168.data;
        (this->weight_data).refcount = local_168.refcount;
        (this->weight_data).elemsize = local_168.elemsize;
        (this->weight_data).elempack = local_168.elempack;
        (this->weight_data).allocator = local_168.allocator;
        (this->weight_data).dims = local_168.dims;
        (this->weight_data).w = local_168.w;
        (this->weight_data).h = local_168.h;
        (this->weight_data).d = local_168.d;
        (this->weight_data).c = local_168.c;
        (this->weight_data).cstep = local_168.cstep;
      }
      if (local_168.refcount != (int *)0x0) {
        LOCK();
        *local_168.refcount = *local_168.refcount + -1;
        UNLOCK();
        if (*local_168.refcount == 0) {
          if (local_168.allocator == (Allocator *)0x0) {
            if (local_168.data != (void *)0x0) {
              free(local_168.data);
            }
          }
          else {
            (*(local_168.allocator)->_vptr_Allocator[3])();
          }
        }
      }
    }
    piVar1 = (int *)CONCAT44(local_118.refcount._4_4_,local_118.refcount._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        if (local_118.allocator == (Allocator *)0x0) {
          if (local_118.data != (void *)0x0) {
            free(local_118.data);
          }
        }
        else {
          (*(local_118.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    local_118.cstep = 0;
    local_118.data = (void *)0x0;
    local_118.refcount._0_4_ = 0;
    local_118.refcount._4_4_ = 0;
    local_118.elemsize._0_4_ = 0;
    local_118._20_8_ = 0;
    local_118.dims = 0;
    local_118.w = 0;
    local_118.h = 0;
    local_118.d = 0;
    local_118.c = 0;
    if (local_c8.refcount != (int *)0x0) {
      LOCK();
      *local_c8.refcount = *local_c8.refcount + -1;
      UNLOCK();
      if (*local_c8.refcount == 0) {
        if (local_c8.allocator == (Allocator *)0x0) {
          if (local_c8.data != (void *)0x0) {
            free(local_c8.data);
          }
        }
        else {
          (*(local_c8.allocator)->_vptr_Allocator[3])();
        }
      }
    }
    if (bVar4 || bVar5) {
      return -100;
    }
  }
  return 0;
}

Assistant:

int InnerProduct::create_pipeline(const Option& opt)
{
#if NCNN_INT8
    // runtime quantize the weight data
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)4u && int8_scale_term)
    {
        const int num_input = weight_data_size / num_output;

        Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

        Mat weight_data_int8;
        Option opt_q = opt;
        opt_q.use_packing_layout = false;
        quantize_to_int8(weight_data_r2, weight_data_int8, weight_data_int8_scales, opt_q);
        if (weight_data_int8.empty())
            return -100;

        weight_data = weight_data_int8.reshape(weight_data_size);
    }
#else
    (void)(opt);
#endif // NCNN_INT8

    return 0;
}